

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall
duckdb::ZSTDScanState::DecompressString
          (ZSTDScanState *this,ZSTDVectorScanState *scan_state,data_ptr_t destination,
          idx_t uncompressed_length)

{
  size_t sVar1;
  uint uVar2;
  size_t code;
  InvalidInputException *this_00;
  char *params;
  allocator local_69;
  ZSTD_outBuffer out_buffer;
  string local_50;
  
  if (uncompressed_length != 0) {
    out_buffer.pos = 0;
    out_buffer.dst = destination;
    out_buffer.size = uncompressed_length;
    while( true ) {
      sVar1 = (scan_state->in_buffer).pos;
      code = duckdb_zstd::ZSTD_decompressStream
                       (this->decompression_context,&out_buffer,&scan_state->in_buffer);
      scan_state->compressed_scan_count =
           scan_state->compressed_scan_count + ((scan_state->in_buffer).pos - sVar1);
      uVar2 = duckdb_zstd::ZSTD_isError(code);
      if (uVar2 != 0) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"ZSTD Decompression failed: %s",&local_69);
        params = duckdb_zstd::ZSTD_getErrorName(code);
        InvalidInputException::InvalidInputException<char_const*>(this_00,&local_50,params);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (out_buffer.pos == out_buffer.size) break;
      LoadNextPageForVector(this,scan_state);
    }
  }
  return;
}

Assistant:

void DecompressString(ZSTDVectorScanState &scan_state, data_ptr_t destination, idx_t uncompressed_length) {
		if (uncompressed_length == 0) {
			return;
		}

		duckdb_zstd::ZSTD_outBuffer out_buffer;

		out_buffer.dst = destination;
		out_buffer.pos = 0;
		out_buffer.size = uncompressed_length;

		while (true) {
			idx_t old_pos = scan_state.in_buffer.pos;
			size_t res = duckdb_zstd::ZSTD_decompressStream(
			    /* zds = */ decompression_context,
			    /* output =*/&out_buffer,
			    /* input =*/&scan_state.in_buffer);
			scan_state.compressed_scan_count += scan_state.in_buffer.pos - old_pos;
			if (duckdb_zstd::ZSTD_isError(res)) {
				throw InvalidInputException("ZSTD Decompression failed: %s", duckdb_zstd::ZSTD_getErrorName(res));
			}
			if (out_buffer.pos == out_buffer.size) {
				break;
			}
			// Did not fully decompress, it needs a new page to read from
			LoadNextPageForVector(scan_state);
		}
	}